

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction.cpp
# Opt level: O0

RPCHelpMan * descriptorprocesspsbt(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCArg> __l_01;
  initializer_list<RPCResult> __l_02;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_ffffffffffffe428;
  allocator<RPCArg> *paVar1;
  allocator<RPCResult> *this;
  RPCArg *this_00;
  UniValue *in_stack_ffffffffffffe430;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_ffffffffffffe438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe460;
  UniValue *in_stack_ffffffffffffe468;
  UniValue *in_stack_ffffffffffffe470;
  undefined7 in_stack_ffffffffffffe478;
  undefined1 in_stack_ffffffffffffe47f;
  string *in_stack_ffffffffffffe480;
  undefined7 in_stack_ffffffffffffe488;
  undefined1 in_stack_ffffffffffffe48f;
  undefined4 in_stack_ffffffffffffe490;
  Type in_stack_ffffffffffffe494;
  string *in_stack_ffffffffffffe498;
  undefined4 in_stack_ffffffffffffe4a0;
  Type in_stack_ffffffffffffe4a4;
  undefined4 in_stack_ffffffffffffe4a8;
  Type in_stack_ffffffffffffe4ac;
  RPCArg *in_stack_ffffffffffffe4b0;
  RPCArgOptions *in_stack_ffffffffffffe4d0;
  undefined1 *local_1b10;
  undefined1 *local_1af8;
  undefined1 *local_1ae0;
  undefined1 *local_1ac8;
  RPCExamples *examples;
  RPCResults *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_01;
  RPCMethodImpl *fun;
  undefined1 local_18a0 [36];
  allocator<char> local_187c;
  allocator<char> local_187b;
  allocator<char> local_187a [2];
  undefined1 local_1878 [30];
  undefined1 local_185a;
  undefined1 local_1859 [31];
  undefined1 local_183a [40];
  allocator<char> local_1812;
  allocator<char> local_1811 [31];
  allocator<char> local_17f2;
  allocator<char> local_17f1 [30];
  allocator<char> local_17d3;
  undefined1 local_17d2;
  allocator<char> local_17d1;
  allocator<char> local_17d0;
  undefined1 local_17cf;
  allocator<char> local_17ce;
  allocator<char> local_17cd;
  allocator<char> local_17cc [3];
  allocator<char> local_17c9;
  undefined1 local_17c8 [7];
  allocator<char> local_17c1 [8];
  allocator<char> local_17b9 [32];
  allocator<char> local_1799 [7];
  allocator<char> local_1792;
  allocator<char> local_1791 [8];
  allocator<char> local_1789 [32];
  allocator<char> local_1769;
  undefined4 local_1768;
  allocator<char> local_1762;
  allocator<char> local_1761;
  undefined4 local_1760;
  allocator<char> local_1759 [31];
  allocator<char> local_173a;
  allocator<char> local_1739 [449];
  undefined1 local_1578 [272];
  vector<RPCArg,_std::allocator<RPCArg>_> local_1468 [5];
  undefined1 local_13e0 [200];
  undefined1 local_1318;
  undefined8 local_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined1 local_12d8;
  undefined1 local_12d7;
  undefined1 local_11d8;
  undefined8 local_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined1 local_1198;
  undefined1 local_1197;
  undefined1 local_1098;
  undefined8 local_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined1 local_1058;
  undefined1 local_1057;
  undefined8 local_1000;
  allocator<RPCArg> local_f58 [40];
  undefined8 local_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined1 local_f18;
  undefined1 local_f17;
  allocator<RPCArg> local_f10 [40];
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined8 local_ed8;
  undefined1 local_ed0;
  undefined1 local_ecf;
  undefined1 local_ec8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 local_e90;
  undefined1 local_e88;
  undefined1 local_e87;
  undefined1 local_d88;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 local_d50;
  undefined1 local_d48;
  undefined1 local_d47;
  undefined1 local_ca0 [528];
  undefined1 local_a90 [160];
  undefined1 local_9f0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined1 local_9b0;
  undefined1 local_9af;
  undefined1 local_908 [528];
  undefined1 local_6f8 [160];
  undefined1 local_658;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined1 local_618;
  undefined1 local_617;
  undefined1 local_570 [264];
  RPCMethodImpl local_468 [33];
  undefined1 local_48 [64];
  long local_8;
  
  local_1000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe47f,in_stack_ffffffffffffe478),
             (char *)in_stack_ffffffffffffe470,(allocator<char> *)in_stack_ffffffffffffe468);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe47f,in_stack_ffffffffffffe478),
             (char *)in_stack_ffffffffffffe470,(allocator<char> *)in_stack_ffffffffffffe468);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe47f,in_stack_ffffffffffffe478),
             (char *)in_stack_ffffffffffffe470,(allocator<char> *)in_stack_ffffffffffffe468);
  local_1760 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe438,&in_stack_ffffffffffffe430->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe47f,in_stack_ffffffffffffe478),
             (char *)in_stack_ffffffffffffe470,(allocator<char> *)in_stack_ffffffffffffe468);
  local_658 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe440);
  local_630 = 0;
  uStack_628 = 0;
  local_620 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe428);
  local_618 = 0;
  local_617 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe4a4,in_stack_ffffffffffffe4a0),
                 in_stack_ffffffffffffe498,in_stack_ffffffffffffe494,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe48f,in_stack_ffffffffffffe488),
                 in_stack_ffffffffffffe480,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffe47f,in_stack_ffffffffffffe478));
  fun = local_468;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe47f,in_stack_ffffffffffffe478),
             (char *)in_stack_ffffffffffffe470,(allocator<char> *)in_stack_ffffffffffffe468);
  local_1768 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe438,&in_stack_ffffffffffffe430->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe47f,in_stack_ffffffffffffe478),
             (char *)in_stack_ffffffffffffe470,(allocator<char> *)in_stack_ffffffffffffe468);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe47f,in_stack_ffffffffffffe478),
             (char *)in_stack_ffffffffffffe470,(allocator<char> *)in_stack_ffffffffffffe468);
  local_1791[1] = (allocator<char>)0x1;
  local_1791[2] = (allocator<char>)0x0;
  local_1791[3] = (allocator<char>)0x0;
  local_1791[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe438,&in_stack_ffffffffffffe430->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe47f,in_stack_ffffffffffffe478),
             (char *)in_stack_ffffffffffffe470,(allocator<char> *)in_stack_ffffffffffffe468);
  local_9f0 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe440);
  local_9c8 = 0;
  uStack_9c0 = 0;
  local_9b8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe428);
  local_9b0 = 0;
  local_9af = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe4a4,in_stack_ffffffffffffe4a0),
                 in_stack_ffffffffffffe498,in_stack_ffffffffffffe494,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe48f,in_stack_ffffffffffffe488),
                 in_stack_ffffffffffffe480,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffe47f,in_stack_ffffffffffffe478));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe47f,in_stack_ffffffffffffe478),
             (char *)in_stack_ffffffffffffe470,(allocator<char> *)in_stack_ffffffffffffe468);
  local_1799[1] = (allocator<char>)0x1;
  local_1799[2] = (allocator<char>)0x0;
  local_1799[3] = (allocator<char>)0x0;
  local_1799[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe438,&in_stack_ffffffffffffe430->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe47f,in_stack_ffffffffffffe478),
             (char *)in_stack_ffffffffffffe470,(allocator<char> *)in_stack_ffffffffffffe468);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe47f,in_stack_ffffffffffffe478),
             (char *)in_stack_ffffffffffffe470,(allocator<char> *)in_stack_ffffffffffffe468);
  local_17c1[1] = (allocator<char>)0x0;
  local_17c1[2] = (allocator<char>)0x0;
  local_17c1[3] = (allocator<char>)0x0;
  local_17c1[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe438,&in_stack_ffffffffffffe430->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe47f,in_stack_ffffffffffffe478),
             (char *)in_stack_ffffffffffffe470,(allocator<char> *)in_stack_ffffffffffffe468);
  local_d88 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe440);
  local_d60 = 0;
  uStack_d58 = 0;
  local_d50 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe428);
  local_d48 = 0;
  local_d47 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe4a4,in_stack_ffffffffffffe4a0),
                 in_stack_ffffffffffffe498,in_stack_ffffffffffffe494,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe48f,in_stack_ffffffffffffe488),
                 in_stack_ffffffffffffe480,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffe47f,in_stack_ffffffffffffe478));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe47f,in_stack_ffffffffffffe478),
             (char *)in_stack_ffffffffffffe470,(allocator<char> *)in_stack_ffffffffffffe468);
  local_17c8._0_4_ = 1000;
  UniValue::UniValue<int,_int,_true>(in_stack_ffffffffffffe468,(int *)in_stack_ffffffffffffe460);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe438,in_stack_ffffffffffffe430);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe47f,in_stack_ffffffffffffe478),
             (char *)in_stack_ffffffffffffe470,(allocator<char> *)in_stack_ffffffffffffe468);
  local_ec8 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe440);
  local_ea0 = 0;
  uStack_e98 = 0;
  local_e90 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe428);
  local_e88 = 0;
  local_e87 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe4a4,in_stack_ffffffffffffe4a0),
                 in_stack_ffffffffffffe498,in_stack_ffffffffffffe494,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe48f,in_stack_ffffffffffffe488),
                 in_stack_ffffffffffffe480,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffe47f,in_stack_ffffffffffffe478));
  std::allocator<RPCArg>::allocator(in_stack_ffffffffffffe428);
  __l._M_len._0_7_ = in_stack_ffffffffffffe478;
  __l._M_array = (iterator)in_stack_ffffffffffffe470;
  __l._M_len._7_1_ = in_stack_ffffffffffffe47f;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe468,__l,
             (allocator_type *)in_stack_ffffffffffffe460);
  local_f10[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string(in_stack_ffffffffffffe440);
  local_ee8 = 0;
  uStack_ee0 = 0;
  local_ed8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe428);
  local_ed0 = 0;
  local_ecf = 0;
  paVar1 = local_f10;
  RPCArg::RPCArg(in_stack_ffffffffffffe4b0,
                 (string *)CONCAT44(in_stack_ffffffffffffe4ac,in_stack_ffffffffffffe4a8),
                 in_stack_ffffffffffffe4a4,(Fallback *)in_stack_ffffffffffffe498,
                 (string *)CONCAT44(in_stack_ffffffffffffe494,in_stack_ffffffffffffe490),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffe48f,in_stack_ffffffffffffe488),
                 in_stack_ffffffffffffe4d0);
  std::allocator<RPCArg>::allocator(paVar1);
  __l_00._M_len._0_7_ = in_stack_ffffffffffffe478;
  __l_00._M_array = (iterator)in_stack_ffffffffffffe470;
  __l_00._M_len._7_1_ = in_stack_ffffffffffffe47f;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe468,__l_00,
             (allocator_type *)in_stack_ffffffffffffe460);
  local_f58[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string(in_stack_ffffffffffffe440);
  local_f30 = 0;
  uStack_f28 = 0;
  local_f20 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar1);
  local_f18 = 0;
  local_f17 = 0;
  paVar1 = local_f58;
  RPCArg::RPCArg(in_stack_ffffffffffffe4b0,
                 (string *)CONCAT44(in_stack_ffffffffffffe4ac,in_stack_ffffffffffffe4a8),
                 in_stack_ffffffffffffe4a4,(Fallback *)in_stack_ffffffffffffe498,
                 (string *)CONCAT44(in_stack_ffffffffffffe494,in_stack_ffffffffffffe490),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffe48f,in_stack_ffffffffffffe488),
                 in_stack_ffffffffffffe4d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe47f,in_stack_ffffffffffffe478),
             (char *)in_stack_ffffffffffffe470,(allocator<char> *)in_stack_ffffffffffffe468);
  UniValue::UniValue<const_char_(&)[35],_char[35],_true>
            (in_stack_ffffffffffffe470,(char (*) [35])in_stack_ffffffffffffe468);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe438,in_stack_ffffffffffffe430);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe47f,in_stack_ffffffffffffe478),
             (char *)in_stack_ffffffffffffe470,(allocator<char> *)in_stack_ffffffffffffe468);
  local_1098 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe440);
  local_1070 = 0;
  uStack_1068 = 0;
  local_1060 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar1);
  local_1058 = 0;
  local_1057 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe4a4,in_stack_ffffffffffffe4a0),
                 in_stack_ffffffffffffe498,in_stack_ffffffffffffe494,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe48f,in_stack_ffffffffffffe488),
                 in_stack_ffffffffffffe480,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffe47f,in_stack_ffffffffffffe478));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe47f,in_stack_ffffffffffffe478),
             (char *)in_stack_ffffffffffffe470,(allocator<char> *)in_stack_ffffffffffffe468);
  local_17cf = 1;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffe468,(bool *)in_stack_ffffffffffffe460);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe438,in_stack_ffffffffffffe430);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe47f,in_stack_ffffffffffffe478),
             (char *)in_stack_ffffffffffffe470,(allocator<char> *)in_stack_ffffffffffffe468);
  local_11d8 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe440);
  local_11b0 = 0;
  uStack_11a8 = 0;
  local_11a0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar1);
  local_1198 = 0;
  local_1197 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe4a4,in_stack_ffffffffffffe4a0),
                 in_stack_ffffffffffffe498,in_stack_ffffffffffffe494,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe48f,in_stack_ffffffffffffe488),
                 in_stack_ffffffffffffe480,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffe47f,in_stack_ffffffffffffe478));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe47f,in_stack_ffffffffffffe478),
             (char *)in_stack_ffffffffffffe470,(allocator<char> *)in_stack_ffffffffffffe468);
  local_17d2 = 1;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffe468,(bool *)in_stack_ffffffffffffe460);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe438,in_stack_ffffffffffffe430);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe47f,in_stack_ffffffffffffe478),
             (char *)in_stack_ffffffffffffe470,(allocator<char> *)in_stack_ffffffffffffe468);
  local_1318 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe440);
  local_12f0 = 0;
  uStack_12e8 = 0;
  local_12e0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar1);
  local_12d8 = 0;
  local_12d7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe4a4,in_stack_ffffffffffffe4a0),
                 in_stack_ffffffffffffe498,in_stack_ffffffffffffe494,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe48f,in_stack_ffffffffffffe488),
                 in_stack_ffffffffffffe480,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffe47f,in_stack_ffffffffffffe478));
  std::allocator<RPCArg>::allocator(paVar1);
  __l_01._M_len._0_7_ = in_stack_ffffffffffffe478;
  __l_01._M_array = (iterator)in_stack_ffffffffffffe470;
  __l_01._M_len._7_1_ = in_stack_ffffffffffffe47f;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe468,__l_01,
             (allocator_type *)in_stack_ffffffffffffe460);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe47f,in_stack_ffffffffffffe478),
             (char *)in_stack_ffffffffffffe470,(allocator<char> *)in_stack_ffffffffffffe468);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe47f,in_stack_ffffffffffffe478),
             (char *)in_stack_ffffffffffffe470,(allocator<char> *)in_stack_ffffffffffffe468);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe47f,in_stack_ffffffffffffe478),
             (char *)in_stack_ffffffffffffe470,(allocator<char> *)in_stack_ffffffffffffe468);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe47f,in_stack_ffffffffffffe478),
             (char *)in_stack_ffffffffffffe470,(allocator<char> *)in_stack_ffffffffffffe468);
  local_183a._2_8_ = 0;
  local_183a._10_8_ = 0;
  local_183a._18_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar1);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffe4b0,in_stack_ffffffffffffe4ac,
             (string *)CONCAT44(in_stack_ffffffffffffe4a4,in_stack_ffffffffffffe4a0),
             in_stack_ffffffffffffe498,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe494,in_stack_ffffffffffffe490),
             (bool)in_stack_ffffffffffffe48f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe47f,in_stack_ffffffffffffe478),
             (char *)in_stack_ffffffffffffe470,(allocator<char> *)in_stack_ffffffffffffe468);
  this_01 = (RPCHelpMan *)local_183a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe47f,in_stack_ffffffffffffe478),
             (char *)in_stack_ffffffffffffe470,(allocator<char> *)in_stack_ffffffffffffe468);
  local_1859._1_8_ = 0;
  local_1859._9_8_ = 0;
  local_1859._17_8_ = 0;
  name = (string *)(local_1859 + 1);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar1);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffe4b0,in_stack_ffffffffffffe4ac,
             (string *)CONCAT44(in_stack_ffffffffffffe4a4,in_stack_ffffffffffffe4a0),
             in_stack_ffffffffffffe498,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe494,in_stack_ffffffffffffe490),
             (bool)in_stack_ffffffffffffe48f);
  args = local_1468;
  description = (string *)local_1859;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe47f,in_stack_ffffffffffffe478),
             (char *)in_stack_ffffffffffffe470,(allocator<char> *)in_stack_ffffffffffffe468);
  results = (RPCResults *)&local_185a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe47f,in_stack_ffffffffffffe478),
             (char *)in_stack_ffffffffffffe470,(allocator<char> *)in_stack_ffffffffffffe468);
  local_1878._0_8_ = (pointer)0x0;
  local_1878._8_8_ = (pointer)0x0;
  local_1878._16_8_ = 0;
  examples = (RPCExamples *)local_1878;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar1);
  this = (allocator<RPCResult> *)((ulong)paVar1 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe4ac,in_stack_ffffffffffffe4a8),
             in_stack_ffffffffffffe4a4,in_stack_ffffffffffffe498,
             SUB41(in_stack_ffffffffffffe494 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe48f,in_stack_ffffffffffffe488),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe480,
             (bool)in_stack_ffffffffffffe47f);
  std::allocator<RPCResult>::allocator(this);
  __l_02._M_len._0_7_ = in_stack_ffffffffffffe478;
  __l_02._M_array = (iterator)in_stack_ffffffffffffe470;
  __l_02._M_len._7_1_ = in_stack_ffffffffffffe47f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe468,__l_02,
             (allocator_type *)in_stack_ffffffffffffe460);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffe4b0,in_stack_ffffffffffffe4ac,
             (string *)CONCAT44(in_stack_ffffffffffffe4a4,in_stack_ffffffffffffe4a0),
             in_stack_ffffffffffffe498,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe494,in_stack_ffffffffffffe490),
             (bool)in_stack_ffffffffffffe48f);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_ffffffffffffe4ac,in_stack_ffffffffffffe4a8),
             (RPCResult *)CONCAT44(in_stack_ffffffffffffe4a4,in_stack_ffffffffffffe4a0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe47f,in_stack_ffffffffffffe478),
             (char *)in_stack_ffffffffffffe470,(allocator<char> *)in_stack_ffffffffffffe468);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe47f,in_stack_ffffffffffffe478),
             (char *)in_stack_ffffffffffffe470,(allocator<char> *)in_stack_ffffffffffffe468);
  HelpExampleCli(in_stack_ffffffffffffe460,in_stack_ffffffffffffe458);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe47f,in_stack_ffffffffffffe478),
             (char *)in_stack_ffffffffffffe470,(allocator<char> *)in_stack_ffffffffffffe468);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe47f,in_stack_ffffffffffffe478),
             (char *)in_stack_ffffffffffffe470,(allocator<char> *)in_stack_ffffffffffffe468);
  HelpExampleCli(in_stack_ffffffffffffe460,in_stack_ffffffffffffe458);
  std::operator+(in_stack_ffffffffffffe460,in_stack_ffffffffffffe458);
  RPCExamples::RPCExamples((RPCExamples *)this,(string *)0x1398c10);
  this_00 = (RPCArg *)local_18a0;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<descriptorprocesspsbt()::__0,void>
            (in_stack_ffffffffffffe438,(anon_class_1_0_00000001 *)in_stack_ffffffffffffe430);
  RPCHelpMan::RPCHelpMan(this_01,name,description,args,results,examples,fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_00);
  RPCExamples::~RPCExamples((RPCExamples *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_18a0 + 0x23));
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_187c);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_187b);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_187a);
  RPCResults::~RPCResults((RPCResults *)this_00);
  RPCResult::~RPCResult((RPCResult *)this_00);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe438);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_1ac8 = local_13e0;
  do {
    local_1ac8 = local_1ac8 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_1ac8 != local_1578);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe438);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_185a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_1859);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe438);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_183a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_183a + 1));
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe438);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1812);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1811);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_17f2);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_17f1);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe438);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  local_1ae0 = local_48;
  do {
    local_1ae0 = local_1ae0 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_1ae0 != local_570);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_17d3);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_17d1);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_17d0);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_17ce);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_17cd);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_17cc);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe438);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  local_1af8 = local_6f8;
  do {
    local_1af8 = local_1af8 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_1af8 != local_908);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe438);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  local_1b10 = local_a90;
  do {
    local_1b10 = local_1b10 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_1b10 != local_ca0);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_17c9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_17c8 + 6));
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_17c1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_17b9);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1799);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1792);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1791);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1789);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1769);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1762);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1761);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1759);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_173a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1739);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan descriptorprocesspsbt()
{
    return RPCHelpMan{"descriptorprocesspsbt",
                "\nUpdate all segwit inputs in a PSBT with information from output descriptors, the UTXO set or the mempool. \n"
                "Then, sign the inputs we are able to with information from the output descriptors. ",
                {
                    {"psbt", RPCArg::Type::STR, RPCArg::Optional::NO, "The transaction base64 string"},
                    {"descriptors", RPCArg::Type::ARR, RPCArg::Optional::NO, "An array of either strings or objects", {
                        {"", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "An output descriptor"},
                        {"", RPCArg::Type::OBJ, RPCArg::Optional::OMITTED, "An object with an output descriptor and extra information", {
                             {"desc", RPCArg::Type::STR, RPCArg::Optional::NO, "An output descriptor"},
                             {"range", RPCArg::Type::RANGE, RPCArg::Default{1000}, "Up to what index HD chains should be explored (either end or [begin,end])"},
                        }},
                    }},
                    {"sighashtype", RPCArg::Type::STR, RPCArg::Default{"DEFAULT for Taproot, ALL otherwise"}, "The signature hash type to sign with if not specified by the PSBT. Must be one of\n"
            "       \"DEFAULT\"\n"
            "       \"ALL\"\n"
            "       \"NONE\"\n"
            "       \"SINGLE\"\n"
            "       \"ALL|ANYONECANPAY\"\n"
            "       \"NONE|ANYONECANPAY\"\n"
            "       \"SINGLE|ANYONECANPAY\""},
                    {"bip32derivs", RPCArg::Type::BOOL, RPCArg::Default{true}, "Include BIP 32 derivation paths for public keys if we know them"},
                    {"finalize", RPCArg::Type::BOOL, RPCArg::Default{true}, "Also finalize inputs if possible"},
                },
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::STR, "psbt", "The base64-encoded partially signed transaction"},
                        {RPCResult::Type::BOOL, "complete", "If the transaction has a complete set of signatures"},
                        {RPCResult::Type::STR_HEX, "hex", /*optional=*/true, "The hex-encoded network transaction if complete"},
                    }
                },
                RPCExamples{
                    HelpExampleCli("descriptorprocesspsbt", "\"psbt\" \"[\\\"descriptor1\\\", \\\"descriptor2\\\"]\"") +
                    HelpExampleCli("descriptorprocesspsbt", "\"psbt\" \"[{\\\"desc\\\":\\\"mydescriptor\\\", \\\"range\\\":21}]\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    // Add descriptor information to a signing provider
    FlatSigningProvider provider;

    auto descs = request.params[1].get_array();
    for (size_t i = 0; i < descs.size(); ++i) {
        EvalDescriptorStringOrObject(descs[i], provider, /*expand_priv=*/true);
    }

    int sighash_type = ParseSighashString(request.params[2]);
    bool bip32derivs = request.params[3].isNull() ? true : request.params[3].get_bool();
    bool finalize = request.params[4].isNull() ? true : request.params[4].get_bool();

    const PartiallySignedTransaction& psbtx = ProcessPSBT(
        request.params[0].get_str(),
        request.context,
        HidingSigningProvider(&provider, /*hide_secret=*/false, !bip32derivs),
        sighash_type,
        finalize);

    // Check whether or not all of the inputs are now signed
    bool complete = true;
    for (const auto& input : psbtx.inputs) {
        complete &= PSBTInputSigned(input);
    }

    DataStream ssTx{};
    ssTx << psbtx;

    UniValue result(UniValue::VOBJ);

    result.pushKV("psbt", EncodeBase64(ssTx));
    result.pushKV("complete", complete);
    if (complete) {
        CMutableTransaction mtx;
        PartiallySignedTransaction psbtx_copy = psbtx;
        CHECK_NONFATAL(FinalizeAndExtractPSBT(psbtx_copy, mtx));
        DataStream ssTx_final;
        ssTx_final << TX_WITH_WITNESS(mtx);
        result.pushKV("hex", HexStr(ssTx_final));
    }
    return result;
},
    };
}